

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O1

olsrv2_tc_node * olsrv2_tc_node_add(netaddr *originator,uint64_t vtime,uint16_t ansn)

{
  avl_node *paVar1;
  olsrv2_tc_node *specific;
  
  paVar1 = avl_find(&_tc_tree,originator);
  specific = (olsrv2_tc_node *)(paVar1 + -6);
  if (paVar1 == (avl_node *)0x0) {
    specific = (olsrv2_tc_node *)oonf_class_malloc(&_tc_node_class);
    if (specific == (olsrv2_tc_node *)0x0) {
      return (olsrv2_tc_node *)0x0;
    }
    os_routing_generic_init_half_os_route_key
              (&(specific->target).prefix.src,(netaddr *)specific,originator);
    (specific->_originator_node).key = specific;
    avl_init(&specific->_edges,avl_comp_netaddr,false);
    avl_init(&specific->_attached_networks,os_routing_avl_cmp_route_key,false);
    (specific->_validity_time).class = &_validity_info;
    specific->ansn = ansn;
    (specific->target).type = OLSRV2_NODE_TARGET;
    olsrv2_routing_dijkstra_node_init(&(specific->target)._dijkstra,(netaddr *)specific);
    avl_insert(&_tc_tree,&specific->_originator_node);
  }
  else {
    if (paVar1[-2].left != (avl_node *)0x0) goto LAB_0013562c;
    *(uint16_t *)&paVar1[-4].left = ansn;
  }
  oonf_class_event(&_tc_node_class,specific,OONF_OBJECT_ADDED);
LAB_0013562c:
  oonf_timer_set_ext(&specific->_validity_time,vtime,vtime);
  return specific;
}

Assistant:

struct olsrv2_tc_node *
olsrv2_tc_node_add(struct netaddr *originator, uint64_t vtime, uint16_t ansn) {
  struct olsrv2_tc_node *node;

  node = avl_find_element(&_tc_tree, originator, node, _originator_node);
  if (!node) {
    node = oonf_class_malloc(&_tc_node_class);
    if (node == NULL) {
      return NULL;
    }

    /* copy key and attach it to node */
    os_routing_init_sourcespec_prefix(&node->target.prefix, originator);
    node->_originator_node.key = &node->target.prefix.dst;

    /* initialize node */
    avl_init(&node->_edges, avl_comp_netaddr, false);
    avl_init(&node->_attached_networks, os_routing_avl_cmp_route_key, false);

    node->_validity_time.class = &_validity_info;

    node->ansn = ansn;

    /* initialize dijkstra data */
    node->target.type = OLSRV2_NODE_TARGET;
    olsrv2_routing_dijkstra_node_init(&node->target._dijkstra, &node->target.prefix.dst);

    /* hook into global tree */
    avl_insert(&_tc_tree, &node->_originator_node);

    /* fire event */
    oonf_class_event(&_tc_node_class, node, OONF_OBJECT_ADDED);
  }
  else if (!oonf_timer_is_active(&node->_validity_time)) {
    /* node was virtual */
    node->ansn = ansn;

    /* fire event */
    oonf_class_event(&_tc_node_class, node, OONF_OBJECT_ADDED);
  }
  oonf_timer_set(&node->_validity_time, vtime);
  return node;
}